

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> * __thiscall
crnlib::vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator=
          (vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *this,
          vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node> *other)

{
  uint uVar1;
  void *pvVar2;
  undefined8 uVar3;
  int iVar4;
  uint i;
  uint uVar5;
  long lVar6;
  vq_node *pvVar7;
  vq_node *pvVar8;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      pvVar7 = this->m_p;
      if (pvVar7 != (vq_node *)0x0) {
        uVar1 = this->m_size;
        if ((ulong)uVar1 != 0) {
          lVar6 = 0;
          do {
            pvVar2 = *(void **)((long)(&pvVar7->m_centroid + 1) + lVar6 + 0x10);
            if (pvVar2 != (void *)0x0) {
              crnlib_free(pvVar2);
            }
            lVar6 = lVar6 + 0x70;
          } while ((ulong)uVar1 * 0x70 - lVar6 != 0);
        }
        crnlib_free(this->m_p);
        this->m_p = (vq_node *)0x0;
        this->m_size = 0;
        this->m_capacity = 0;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this,other->m_size,false,0x70,object_mover,false);
    }
    else {
      uVar1 = this->m_size;
      if ((ulong)uVar1 != 0) {
        pvVar7 = this->m_p;
        lVar6 = 0;
        do {
          pvVar2 = *(void **)((long)(&pvVar7->m_centroid + 1) + lVar6 + 0x10);
          if (pvVar2 != (void *)0x0) {
            crnlib_free(pvVar2);
          }
          lVar6 = lVar6 + 0x70;
        } while ((ulong)uVar1 * 0x70 - lVar6 != 0);
        this->m_size = 0;
      }
    }
    uVar5 = other->m_size;
    if (uVar5 != 0) {
      pvVar7 = this->m_p;
      pvVar8 = other->m_p;
      do {
        lVar6 = 0;
        do {
          (pvVar7->m_centroid).m_s[lVar6] = (pvVar8->m_centroid).m_s[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x10);
        pvVar7->m_variance = pvVar8->m_variance;
        pvVar7->m_total_weight = pvVar8->m_total_weight;
        (pvVar7->m_vectors).m_p = (uint *)0x0;
        (pvVar7->m_vectors).m_size = 0;
        (pvVar7->m_vectors).m_capacity = 0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)&pvVar7->m_vectors,(pvVar8->m_vectors).m_size,false,4,
                   (object_mover)0x0,false);
        uVar1 = (pvVar8->m_vectors).m_size;
        (pvVar7->m_vectors).m_size = uVar1;
        memcpy((pvVar7->m_vectors).m_p,(pvVar8->m_vectors).m_p,(ulong)uVar1 << 2);
        iVar4 = pvVar8->m_right;
        uVar3 = *(undefined8 *)((long)&pvVar8->m_right + 1);
        pvVar7->m_left = pvVar8->m_left;
        pvVar7->m_right = iVar4;
        *(undefined8 *)((long)&pvVar7->m_right + 1) = uVar3;
        uVar5 = uVar5 - 1;
        pvVar7 = pvVar7 + 1;
        pvVar8 = pvVar8 + 1;
      } while (uVar5 != 0);
    }
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (m_capacity >= other.m_size)
            {
                resize(0);
            }
            else
            {
                clear();
                increase_capacity(other.m_size, false);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = other.m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }

            m_size = other.m_size;

            return *this;
        }